

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *x,
       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *rhs)

{
  pointer pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar2;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  
  if ((int)((ulong)((long)(rhs->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(rhs->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 != 0) {
    if (this->factorized == false) {
      factorize(this);
    }
    (*this->factor->_vptr_SLinSolver[0xc])(this->factor,x,rhs);
    return;
  }
  pnVar1 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar2 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar2 != pnVar1; pnVar2 = pnVar2 + 1) {
    (pnVar2->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar2->m_backend).prec_elem = 10;
    (pnVar2->m_backend).data._M_elems[0] = 0;
    (pnVar2->m_backend).data._M_elems[1] = 0;
    (pnVar2->m_backend).data._M_elems[2] = 0;
    (pnVar2->m_backend).data._M_elems[3] = 0;
    (pnVar2->m_backend).data._M_elems[4] = 0;
    (pnVar2->m_backend).data._M_elems[5] = 0;
    (pnVar2->m_backend).data._M_elems[6] = 0;
    (pnVar2->m_backend).data._M_elems[7] = 0;
    *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + 0x1d) = 0;
    *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + 0x25) = 0;
  }
  return;
}

Assistant:

void solve(VectorBase<R>& x, const VectorBase<R>& rhs)
   {
      if(rhs.dim() == 0)
      {
         x.clear();
         return;
      }

      if(!factorized)
         SPxBasisBase<R>::factorize();

      factor->solveRight(x, rhs);
   }